

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O0

shared_ptr<helics::Broker> helics::BrokerFactory::findJoinableBrokerOfType(CoreType type)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  anon_class_1_0_00000001 *in_RDI;
  shared_ptr<helics::Broker> sVar1;
  CoreType in_stack_0000003c;
  function<bool_(const_std::shared_ptr<helics::Broker>_&)> *in_stack_00000040;
  SearchableObjectHolder<helics::Core,_helics::CoreType> *in_stack_00000048;
  function<bool_(const_std::shared_ptr<helics::Broker>_&)> local_30;
  
  std::function<bool(std::shared_ptr<helics::Broker>const&)>::
  function<helics::BrokerFactory::findJoinableBrokerOfType(helics::CoreType)::__0,void>
            (&local_30,in_RDI);
  gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::findObject
            (in_stack_00000048,in_stack_00000040,in_stack_0000003c);
  std::function<bool_(const_std::shared_ptr<helics::Broker>_&)>::~function
            ((function<bool_(const_std::shared_ptr<helics::Broker>_&)> *)0x439074);
  sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<helics::Broker>)
         sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Broker> findJoinableBrokerOfType(CoreType type)
{
    return searchableBrokers.findObject([](auto& ptr) { return ptr->isOpenToNewFederates(); },
                                        type);
}